

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Config::~Config(Config *this)

{
  Config *this_local;
  
  (this->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__Config_00380f70;
  TestSpec::~TestSpec(&this->m_testSpec);
  std::unique_ptr<const_Catch::IStream,_std::default_delete<const_Catch::IStream>_>::~unique_ptr
            (&this->m_stream);
  ConfigData::~ConfigData(&this->m_data);
  SharedImpl<Catch::IConfig>::~SharedImpl(&this->super_SharedImpl<Catch::IConfig>);
  return;
}

Assistant:

virtual ~Config() {
        }